

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

HanabiCard __thiscall
hanabi_learning_env::HanabiState::HanabiDeck::DealCard(HanabiDeck *this,mt19937 *rng)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  result_type rVar5;
  HanabiCard HVar6;
  discrete_distribution<unsigned_long> dist;
  
  if (this->total_count_ == 0) {
    HVar6.color_ = -1;
    HVar6.rank_ = -1;
  }
  else {
    std::discrete_distribution<unsigned_long>::param_type::
    param_type<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&dist._M_param,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->card_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->card_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    rVar5 = std::discrete_distribution<unsigned_long>::operator()(&dist,rng);
    piVar2 = (this->card_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = (int)rVar5;
    iVar1 = piVar2[iVar4];
    if (iVar1 < 1) {
      __assert_fail("card_count_[index] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                    ,0x49,
                    "HanabiCard hanabi_learning_env::HanabiState::HanabiDeck::DealCard(std::mt19937 *)"
                   );
    }
    piVar2[iVar4] = iVar1 + -1;
    this->total_count_ = this->total_count_ + -1;
    iVar1 = this->num_ranks_;
    uVar3 = (ulong)(uint)(iVar4 >> 0x1f) << 0x20 | rVar5 & 0xffffffff;
    std::discrete_distribution<unsigned_long>::param_type::~param_type(&dist._M_param);
    HVar6 = (HanabiCard)
            ((long)uVar3 / (long)iVar1 & 0xffffffffU | (long)uVar3 % (long)iVar1 << 0x20);
  }
  return HVar6;
}

Assistant:

uint8_t HandRankBitmask(const HanabiHand& hand, int rank) {
  uint8_t mask = 0;
  const auto& cards = hand.Cards();
  assert(cards.size() <= 8);  // More than 8 cards is not supported.
  for (int i = 0; i < cards.size(); ++i) {
    if (cards[i].Rank() == rank) {
      mask |= static_cast<uint8_t>(1) << i;
    }
  }
  return mask;
}